

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O3

int entity7(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  int iVar1;
  code *pcVar2;
  int iVar3;
  
  iVar3 = 0xb;
  if (tok == 0xf) {
    return 0xb;
  }
  if (tok == 0x1b) {
    state->handler = declClose;
    state->role_none = 0xb;
    return 0xc;
  }
  if (tok == 0x12) {
    iVar1 = (*enc->nameMatchesAscii)(enc,ptr,end,"SYSTEM");
    if (iVar1 == 0) {
      iVar1 = (*enc->nameMatchesAscii)(enc,ptr,end,"PUBLIC");
      if (iVar1 == 0) goto LAB_00173298;
      pcVar2 = entity8;
    }
    else {
      pcVar2 = entity9;
    }
    state->handler = pcVar2;
  }
  else {
    if ((tok == 0x1c) && (state->documentEntity == 0)) {
      return 0x3b;
    }
LAB_00173298:
    state->handler = error;
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

static int PTRCALL
entity7(PROLOG_STATE *state, int tok, const char *ptr, const char *end,
        const ENCODING *enc) {
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_ENTITY_NONE;
  case XML_TOK_NAME:
    if (XmlNameMatchesAscii(enc, ptr, end, KW_SYSTEM)) {
      state->handler = entity9;
      return XML_ROLE_ENTITY_NONE;
    }
    if (XmlNameMatchesAscii(enc, ptr, end, KW_PUBLIC)) {
      state->handler = entity8;
      return XML_ROLE_ENTITY_NONE;
    }
    break;
  case XML_TOK_LITERAL:
    state->handler = declClose;
    state->role_none = XML_ROLE_ENTITY_NONE;
    return XML_ROLE_ENTITY_VALUE;
  }
  return common(state, tok);
}